

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O0

oonf_layer2_data *
oonf_layer2_neigh_query
          (char *ifname,netaddr *l2neigh_addr,oonf_layer2_neighbor_index idx,_Bool get_default)

{
  avl_tree *paVar1;
  oonf_layer2_data *poVar2;
  bool bVar3;
  long local_c0;
  long local_b8;
  oonf_layer2_data *data;
  oonf_layer2_neigh *l2neigh;
  oonf_layer2_net *l2net;
  _Bool get_default_local;
  oonf_layer2_neighbor_index idx_local;
  netaddr *l2neigh_addr_local;
  char *ifname_local;
  undefined8 local_4b;
  oonf_layer2_neigh_key key;
  
  paVar1 = oonf_layer2_get_net_tree();
  local_b8 = avl_find(paVar1);
  if (local_b8 == 0) {
    local_b8 = 0;
  }
  else {
    local_b8 = local_b8 + -0x7a0;
  }
  if (local_b8 == 0) {
    ifname_local = (char *)0x0;
  }
  else {
    key.link_id._8_8_ = l2neigh_addr;
    memset(&local_4b,0,0x23);
    local_4b = *(undefined8 *)key.link_id._8_8_;
    key.addr._addr._0_8_ = *(undefined8 *)(key.link_id._8_8_ + 8);
    key.addr._addr._8_2_ = *(undefined2 *)(key.link_id._8_8_ + 0x10);
    local_c0 = avl_find(local_b8 + 0x90,&local_4b);
    if (local_c0 == 0) {
      local_c0 = 0;
    }
    else {
      local_c0 = local_c0 + -0x4c0;
    }
    if (local_c0 != 0) {
      poVar2 = (oonf_layer2_data *)(local_c0 + 0xb0 + (ulong)idx * 0x28);
      bVar3 = false;
      if (poVar2->_origin != (oonf_layer2_origin *)0x0) {
        bVar3 = poVar2->_meta != (oonf_layer2_metadata *)0x0;
      }
      if (bVar3) {
        return poVar2;
      }
    }
    if (get_default) {
      ifname_local = (char *)(local_b8 + 0x390 + (ulong)idx * 0x28);
      bVar3 = false;
      if (*(long *)(ifname_local + 0x20) != 0) {
        bVar3 = *(long *)(ifname_local + 0x18) != 0;
      }
      if (!bVar3) {
        ifname_local = (char *)0x0;
      }
    }
    else {
      ifname_local = (char *)0x0;
    }
  }
  return (oonf_layer2_data *)ifname_local;
}

Assistant:

struct oonf_layer2_data *
oonf_layer2_neigh_query(const char *ifname, const struct netaddr *l2neigh_addr,
      enum oonf_layer2_neighbor_index idx, bool get_default) {
  struct oonf_layer2_net *l2net;
  struct oonf_layer2_neigh *l2neigh;
  struct oonf_layer2_data *data;

  /* query layer2 database about neighbor */
  l2net = oonf_layer2_net_get(ifname);
  if (l2net == NULL) {
    return NULL;
  }

  /* look for neighbor specific data */
  l2neigh = oonf_layer2_neigh_get(l2net, l2neigh_addr);
  if (l2neigh != NULL) {
    data = &l2neigh->data[idx];
    if (oonf_layer2_data_has_value(data)) {
      return data;
    }
  }

  if (!get_default) {
    return NULL;
  }

  /* look for network specific default */
  data = &l2net->neighdata[idx];
  if (oonf_layer2_data_has_value(data)) {
    return data;
  }
  return NULL;
}